

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

SHMPTR SHMWStrDup(LPCWSTR string)

{
  uint uVar1;
  size_t sVar2;
  LPVOID __dest;
  LPVOID ptr;
  SHMPTR retVal;
  UINT length;
  LPCWSTR string_local;
  
  ptr = (LPVOID)0x0;
  if (string != (LPCWSTR)0x0) {
    sVar2 = PAL_wcslen(string);
    uVar1 = ((int)sVar2 + 1) * 2;
    ptr = (LPVOID)SHMalloc((ulong)uVar1);
    if (ptr != (LPVOID)0x0) {
      __dest = SHMPtrToPtr((SHMPTR)ptr);
      if (__dest == (LPVOID)0x0) {
        fprintf(_stderr,"] %s %s:%d","SHMWStrDup",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x530);
        fprintf(_stderr,"Expression: ptr != NULL, Description: SHMPTR_TO_PTR returned NULL.\n");
        SHMfree((SHMPTR)ptr);
        ptr = (LPVOID)0x0;
      }
      else {
        memcpy(__dest,string,(ulong)uVar1);
      }
    }
  }
  return (SHMPTR)ptr;
}

Assistant:

SHMPTR SHMWStrDup( LPCWSTR string )
{
    UINT length = 0;
    SHMPTR retVal = 0;

    if ( string )
    {
        length = ( PAL_wcslen( string ) + 1 ) * sizeof( WCHAR );

        retVal = SHMalloc( length );

        if ( retVal != 0 )
        {
            LPVOID ptr = SHMPTR_TO_PTR(retVal);
            _ASSERT_MSG(ptr != NULL, "SHMPTR_TO_PTR returned NULL.\n");
            if (ptr != NULL)
            {
                memcpy( ptr, string, length );
            }
            else
            {
                // This code should never be reached. If a valid pointer
                // is passed to SHMPTR_TO_PTR and NULL is returned, then
                // there's a problem in either the macro, or the underlying
                // call to SHMPtrToPtr. In case the impossible happens,
                // though, free the memory and return NULL rather than
                // returning uninitialized memory.
                SHMfree( retVal );
                retVal = NULL;
            }
        }
    }
    return retVal;
}